

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int open_get_desired_capabilities(OPEN_HANDLE open,AMQP_VALUE *desired_capabilities_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  AMQP_VALUE single_amqp_value;
  char *pcStack_38;
  int get_single_value_result;
  char *desired_capabilities_single_value;
  AMQP_VALUE item_value;
  OPEN_INSTANCE *open_instance;
  uint32_t item_count;
  int result;
  AMQP_VALUE *desired_capabilities_value_local;
  OPEN_HANDLE open_local;
  
  if (open == (OPEN_HANDLE)0x0) {
    open_instance._4_4_ = 0x7b7;
  }
  else {
    item_value = (AMQP_VALUE)open;
    _item_count = desired_capabilities_value;
    desired_capabilities_value_local = &open->composite_value;
    iVar1 = amqpvalue_get_composite_item_count(open->composite_value,(uint32_t *)&open_instance);
    if (iVar1 == 0) {
      if ((uint)open_instance < 9) {
        open_instance._4_4_ = 0x7c5;
      }
      else {
        desired_capabilities_single_value =
             (char *)amqpvalue_get_composite_item_in_place(*(AMQP_VALUE *)item_value,8);
        if (((AMQP_VALUE)desired_capabilities_single_value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type((AMQP_VALUE)desired_capabilities_single_value),
           AVar2 == AMQP_TYPE_NULL)) {
          open_instance._4_4_ = 0x7cd;
        }
        else {
          AVar2 = amqpvalue_get_type((AMQP_VALUE)desired_capabilities_single_value);
          if (AVar2 == AMQP_TYPE_ARRAY) {
            memset(&stack0xffffffffffffffc8,0,8);
            single_amqp_value._4_4_ = 1;
          }
          else {
            single_amqp_value._4_4_ =
                 amqpvalue_get_symbol
                           ((AMQP_VALUE)desired_capabilities_single_value,&stack0xffffffffffffffc8);
          }
          AVar2 = amqpvalue_get_type((AMQP_VALUE)desired_capabilities_single_value);
          if (((AVar2 == AMQP_TYPE_ARRAY) &&
              (iVar1 = amqpvalue_get_array((AMQP_VALUE)desired_capabilities_single_value,_item_count
                                          ), iVar1 == 0)) || (single_amqp_value._4_4_ == 0)) {
            AVar2 = amqpvalue_get_type((AMQP_VALUE)desired_capabilities_single_value);
            if (AVar2 == AMQP_TYPE_ARRAY) {
              open_instance._4_4_ = 0;
            }
            else {
              pAVar3 = amqpvalue_create_array();
              *_item_count = pAVar3;
              if (*_item_count == (AMQP_VALUE)0x0) {
                open_instance._4_4_ = 0x7e9;
              }
              else {
                pAVar3 = amqpvalue_create_symbol(pcStack_38);
                if (pAVar3 == (AMQP_VALUE)0x0) {
                  open_instance._4_4_ = 0x7f0;
                }
                else {
                  iVar1 = amqpvalue_add_array_item(*_item_count,pAVar3);
                  if (iVar1 == 0) {
                    iVar1 = amqpvalue_set_composite_item(*(AMQP_VALUE *)item_value,8,*_item_count);
                    if (iVar1 == 0) {
                      open_instance._4_4_ = 0;
                    }
                    else {
                      open_instance._4_4_ = 0x7fc;
                    }
                  }
                  else {
                    open_instance._4_4_ = 0x7f6;
                  }
                  amqpvalue_destroy(pAVar3);
                }
                amqpvalue_destroy(*_item_count);
              }
            }
          }
          else {
            open_instance._4_4_ = 0x7e0;
          }
        }
      }
    }
    else {
      open_instance._4_4_ = 0x7bf;
    }
  }
  return open_instance._4_4_;
}

Assistant:

int open_get_desired_capabilities(OPEN_HANDLE open, AMQP_VALUE* desired_capabilities_value)
{
    int result;

    if (open == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open;
        if (amqpvalue_get_composite_item_count(open_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 8)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(open_instance->composite_value, 8);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    const char* desired_capabilities_single_value;
                    int get_single_value_result;
                    if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                    {
                        get_single_value_result = amqpvalue_get_symbol(item_value, &desired_capabilities_single_value);
                    }
                    else
                    {
                        (void)memset((void*)&desired_capabilities_single_value, 0, sizeof(desired_capabilities_single_value));
                        get_single_value_result = 1;
                    }

                    if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, desired_capabilities_value) != 0)) &&
                        (get_single_value_result != 0))
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                        {
                            *desired_capabilities_value = amqpvalue_create_array();
                            if (*desired_capabilities_value == NULL)
                            {
                                result = MU_FAILURE;
                            }
                            else
                            {
                                AMQP_VALUE single_amqp_value = amqpvalue_create_symbol(desired_capabilities_single_value);
                                if (single_amqp_value == NULL)
                                {
                                    result = MU_FAILURE;
                                }
                                else
                                {
                                    if (amqpvalue_add_array_item(*desired_capabilities_value, single_amqp_value) != 0)
                                    {
                                        result = MU_FAILURE;
                                    }
                                    else
                                    {
                                        if (amqpvalue_set_composite_item(open_instance->composite_value, 8, *desired_capabilities_value) != 0)
                                        {
                                            result = MU_FAILURE;
                                        }
                                        else
                                        {
                                            result = 0;
                                        }
                                    }

                                    amqpvalue_destroy(single_amqp_value);
                                }
                                amqpvalue_destroy(*desired_capabilities_value);
                            }
                        }
                        else
                        {
                            result = 0;
                        }
                    }
                }
            }
        }
    }

    return result;
}